

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

int64_t __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  long lVar1;
  uint8_t *puVar2;
  Nullable<const_char_*> pcVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint8_t *puVar7;
  pair<unsigned_long,_bool> pVar8;
  int local_2c;
  LogMessage local_28;
  
  puVar2 = this->buffer_end_;
  if (((int)puVar2 - (int)this->buffer_ < 10) &&
     ((puVar2 <= this->buffer_ || ((char)puVar2[-1] < '\0')))) {
    pVar8 = ReadVarint64Fallback(this);
    uVar4 = 0xffffffffffffffff;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar4 = (ulong)(uint)pVar8.first;
    }
    return uVar4;
  }
  local_2c = 0;
  local_28.errno_saver_.saved_errno_ = first_byte_or_zero;
  pcVar3 = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_int,int>
                     ((uint *)&local_28,&local_2c,"first_byte_or_zero != 0");
  if (pcVar3 == (Nullable<const_char_*>)0x0) {
    puVar2 = this->buffer_;
    local_2c = CONCAT31(local_2c._1_3_,*puVar2);
    local_28.errno_saver_.saved_errno_ = first_byte_or_zero;
    pcVar3 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_char,unsigned_int>
                       ((uchar *)&local_2c,(uint *)&local_28,"*buffer == first_byte");
    if (pcVar3 != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1ae,pcVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_28);
    }
    local_28.errno_saver_.saved_errno_ = first_byte_or_zero & 0x80;
    local_2c = 0x80;
    pcVar3 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,int>
                       ((uint *)&local_28,&local_2c,"first_byte & 0x80 == 0x80");
    if (pcVar3 == (Nullable<const_char_*>)0x0) {
      uVar5 = ((uint)puVar2[1] * 0x80 + first_byte_or_zero) - 0x80;
      if ((char)puVar2[1] < '\0') {
        uVar5 = (uVar5 + (uint)puVar2[2] * 0x4000) - 0x4000;
        if ((char)puVar2[2] < '\0') {
          uVar5 = (uVar5 + (uint)puVar2[3] * 0x200000) - 0x200000;
          if ((char)puVar2[3] < '\0') {
            puVar7 = puVar2 + 5;
            uVar5 = uVar5 + (uint)puVar2[4] * 0x10000000 + 0xf0000000;
            if ((char)puVar2[4] < '\0') {
              lVar6 = 0;
              do {
                if ((int)lVar6 == 5) {
                  return -1;
                }
                lVar1 = lVar6 + 1;
                puVar2 = puVar7 + lVar6;
                lVar6 = lVar1;
              } while ((char)*puVar2 < '\0');
              puVar7 = puVar7 + lVar1;
            }
          }
          else {
            puVar7 = puVar2 + 4;
          }
        }
        else {
          puVar7 = puVar2 + 3;
        }
      }
      else {
        puVar7 = puVar2 + 2;
      }
      this->buffer_ = puVar7;
      return (ulong)uVar5;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1af,pcVar3);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_28,first_byte_or_zero);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x207,pcVar3);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_28,
               (char (*) [64])"Caller should provide us with *buffer_ when buffer is non-empty");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

int64_t CodedInputStream::ReadVarint32Fallback(uint32_t first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32_t temp;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32_t temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64_t>(temp) : -1;
  }
}